

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O0

void __thiscall
Iir::ChebyshevI::BandShelfBase::setup
          (BandShelfBase *this,int order,double centerFrequency,double widthFrequency,double gainDb,
          double rippleDb)

{
  long in_RDI;
  double in_XMM0_Qa;
  Cascade *in_XMM3_Qa;
  undefined4 in_stack_00000068;
  int in_stack_0000007c;
  AnalogLowShelf *in_stack_00000080;
  LayoutBase *in_stack_00000090;
  LayoutBase *in_stack_00000098;
  double in_stack_000000a0;
  double in_stack_000000a8;
  BandPassTransform *in_stack_000000b0;
  LayoutBase *in_stack_ffffffffffffffc8;
  
  AnalogLowShelf::design
            (in_stack_00000080,in_stack_0000007c,(double)this,
             (double)CONCAT44(order,in_stack_00000068));
  BandPassTransform::BandPassTransform
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
             in_stack_00000090);
  LayoutBase::setNormal
            ((LayoutBase *)(in_RDI + 0x10),
             (double)(-(ulong)(in_XMM0_Qa < 0.25) & 0x400921fb54442d18),1.0);
  Cascade::setLayout(in_XMM3_Qa,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void BandShelfBase::setup (int order,
                           double centerFrequency,
                           double widthFrequency,
                           double gainDb,
                           double rippleDb)
{
  m_analogProto.design (order, gainDb, rippleDb);

  BandPassTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  m_digitalProto.setNormal ( (centerFrequency < 0.25) ? doublePi : 0, 1);

  Cascade::setLayout (m_digitalProto);
}